

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t cfd::core::CalculateRangeProofSize(int64_t amount,int exponent,int minimum_bits)

{
  pointer pcVar1;
  uint32_t uVar2;
  pointer puVar3;
  size_t sVar4;
  value_type_conflict *__val;
  int minimum_bits_local;
  int exponent_local;
  undefined1 local_178 [60];
  uint32_t rangeproof_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_factor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> range_proof;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment;
  ByteData256 key_data;
  ByteData vbf_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf;
  ConfidentialAssetId asset;
  Privkey privkey;
  ByteData local_48;
  
  pcVar1 = local_178 + 0x10;
  minimum_bits_local = minimum_bits;
  exponent_local = exponent;
  local_178._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"e863b2791be1be9659a940123143f210b9760a3b85862bf0833ef27c80c83816",
             "");
  ByteData::ByteData(&vbf_data,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  local_178._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"7df80e5705518368f2e1598e177f4929ba5ab54ab8177582dcc7504fc333c84e",
             "");
  ByteData256::ByteData256(&key_data,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  local_178._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"3668f9bdc8f1cc9c1a0247613fffa17b18e3141898e011386b831709c518d805",
             "");
  ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (pointer)operator_new(0x20);
  empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + 0x20;
  puVar3[0x10] = '\0';
  puVar3[0x11] = '\0';
  puVar3[0x12] = '\0';
  puVar3[0x13] = '\0';
  puVar3[0x14] = '\0';
  puVar3[0x15] = '\0';
  puVar3[0x16] = '\0';
  puVar3[0x17] = '\0';
  puVar3[0x18] = '\0';
  puVar3[0x19] = '\0';
  puVar3[0x1a] = '\0';
  puVar3[0x1b] = '\0';
  puVar3[0x1c] = '\0';
  puVar3[0x1d] = '\0';
  puVar3[0x1e] = '\0';
  puVar3[0x1f] = '\0';
  puVar3[0] = '\0';
  puVar3[1] = '\0';
  puVar3[2] = '\0';
  puVar3[3] = '\0';
  puVar3[4] = '\0';
  puVar3[5] = '\0';
  puVar3[6] = '\0';
  puVar3[7] = '\0';
  puVar3[8] = '\0';
  puVar3[9] = '\0';
  puVar3[10] = '\0';
  puVar3[0xb] = '\0';
  puVar3[0xc] = '\0';
  puVar3[0xd] = '\0';
  puVar3[0xe] = '\0';
  puVar3[0xf] = '\0';
  empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::GetBytes(&vbf,&vbf_data);
  Privkey::Privkey(&privkey,&key_data,kMainnet,true);
  commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Script::Script((Script *)local_178);
  CalculateRangeProof(&local_48,amount,(Pubkey *)0x0,&privkey,&asset,&empty_factor,&vbf,
                      (Script *)local_178,1,exponent_local,minimum_bits_local,&commitment,
                      &range_proof);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Script::~Script((Script *)local_178);
  ByteData::ByteData((ByteData *)local_178,&range_proof);
  sVar4 = ByteData::GetSerializeSize((ByteData *)local_178);
  if ((pointer)local_178._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
  }
  rangeproof_size = (uint32_t)sVar4;
  local_178._0_8_ = "cfdcore_elements_transaction.cpp";
  local_178._8_4_ = 0xe2;
  local_178._16_8_ = "CalculateRangeProofSize";
  logger::log<int&,int&,unsigned_int&>
            ((CfdSourceLocation *)local_178,kCfdLogLevelInfo,"[{},{}] rangeproof_size[{}]",
             &exponent_local,&minimum_bits_local,&rangeproof_size);
  uVar2 = rangeproof_size;
  if (range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)range_proof.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)range_proof.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)commitment.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)commitment.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (privkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(privkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)privkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)privkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(puVar3,0x20);
  asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_007f6a80;
  if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)asset.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)asset.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (key_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(key_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)key_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)key_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vbf_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vbf_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vbf_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vbf_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

static uint32_t CalculateRangeProofSize(
    int64_t amount, int exponent, int minimum_bits) {
  // dummy value
  ByteData vbf_data(
      "e863b2791be1be9659a940123143f210b9760a3b85862bf0833ef27c80c83816");
  ByteData256 key_data(
      "7df80e5705518368f2e1598e177f4929ba5ab54ab8177582dcc7504fc333c84e");
  ConfidentialAssetId asset(
      "3668f9bdc8f1cc9c1a0247613fffa17b18e3141898e011386b831709c518d805");
  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  std::vector<uint8_t> vbf = vbf_data.GetBytes();
  Privkey privkey(key_data);
  std::vector<uint8_t> commitment;
  std::vector<uint8_t> range_proof;
  uint64_t value = static_cast<uint64_t>(amount);
  CalculateRangeProof(
      value, nullptr, privkey, asset, empty_factor, vbf, Script(), 1, exponent,
      minimum_bits, &commitment, &range_proof);
  uint32_t rangeproof_size =
      static_cast<uint32_t>(ByteData(range_proof).GetSerializeSize());
  info(
      CFD_LOG_SOURCE, "[{},{}] rangeproof_size[{}]", exponent, minimum_bits,
      rangeproof_size);
  return rangeproof_size;
}